

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QTransform * __thiscall
QGraphicsItem::itemTransform(QGraphicsItem *this,QGraphicsItem *other,bool *ok)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsItemPrivate *pQVar3;
  QGraphicsItem *pQVar4;
  QGraphicsItem *in_RCX;
  QGraphicsItem *in_RDX;
  QGraphicsItem *in_RSI;
  QTransform *in_RDI;
  long in_FS_OFFSET;
  qreal qVar5;
  qreal qVar6;
  QGraphicsItem *p;
  QGraphicsItem *root;
  QGraphicsItem *child;
  bool parentOfOther;
  bool cousins;
  QGraphicsItem *commonAncestor;
  QPointF *otherPos_1;
  QPointF *itemPos;
  QPointF *otherPos;
  QGraphicsItem *otherParent;
  QGraphicsItem *parent;
  bool good;
  QPointF delta;
  QTransform x;
  QTransform otherToScene;
  QTransform thisToScene;
  QTransform otherToParent_1;
  QTransform itemToParent;
  QTransform otherToParent;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  QGraphicsItemPrivate *in_stack_fffffffffffffbf0;
  QGraphicsItem *pQVar7;
  QPointF *in_stack_fffffffffffffbf8;
  QGraphicsItem *viewTransform;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  undefined1 uVar8;
  QGraphicsItemPrivate *in_stack_fffffffffffffc08;
  QTransform *pQVar9;
  QGraphicsItem *in_stack_fffffffffffffc10;
  QGraphicsItem *in_stack_fffffffffffffc18;
  QGraphicsItem *local_3c8;
  QPointF local_358;
  char local_348 [32];
  undefined1 local_328 [240];
  QTransform local_238;
  undefined1 local_1e8 [80];
  bool local_198 [80];
  bool local_148 [80];
  undefined1 local_f8 [80];
  undefined1 local_a8 [80];
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == (QGraphicsItem *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (char *)in_stack_fffffffffffffbf8,(int)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
    QMessageLogger::warning(local_348,"QGraphicsItem::itemTransform: null pointer passed");
    QTransform::QTransform((QTransform *)in_stack_fffffffffffffbf0);
  }
  else if (in_RDX == in_RSI) {
    if (in_RCX != (QGraphicsItem *)0x0) {
      *(undefined1 *)&in_RCX->_vptr_QGraphicsItem = 1;
    }
    QTransform::QTransform((QTransform *)in_stack_fffffffffffffbf0);
  }
  else {
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RSI->d_ptr);
    pQVar7 = pQVar2->parent;
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RDX->d_ptr);
    if (pQVar7 == in_RDX) {
      if (in_RCX != (QGraphicsItem *)0x0) {
        *(undefined1 *)&in_RCX->_vptr_QGraphicsItem = 1;
      }
      memcpy(in_RDI,&DAT_00b41e00,0x50);
      QTransform::QTransform((QTransform *)in_stack_fffffffffffffbf0);
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&in_RSI->d_ptr);
      QGraphicsItemPrivate::combineTransformFromParent
                (in_stack_fffffffffffffc08,
                 (QTransform *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                 (QTransform *)in_stack_fffffffffffffbf8);
    }
    else if (pQVar2->parent == in_RSI) {
      pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&in_RDX->d_ptr);
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&in_RDX->d_ptr);
      if (pQVar3->transformData == (TransformData *)0x0) {
        if (in_RCX != (QGraphicsItem *)0x0) {
          *(undefined1 *)&in_RCX->_vptr_QGraphicsItem = 1;
        }
        qVar5 = QPointF::x(&pQVar2->pos);
        qVar5 = -qVar5;
        qVar6 = QPointF::y(&pQVar2->pos);
        QTransform::fromTranslate(qVar5,-qVar6);
      }
      else {
        memcpy(local_58,&DAT_00b41e50,0x50);
        QTransform::QTransform((QTransform *)in_stack_fffffffffffffbf0);
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->(&in_RDX->d_ptr);
        QGraphicsItemPrivate::combineTransformFromParent
                  (in_stack_fffffffffffffc08,
                   (QTransform *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                   (QTransform *)in_stack_fffffffffffffbf8);
        QTransform::inverted((bool *)in_RDI);
      }
    }
    else if (pQVar7 == pQVar2->parent) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&in_RSI->d_ptr);
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&in_RDX->d_ptr);
      pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&in_RSI->d_ptr);
      if ((pQVar2->transformData == (TransformData *)0x0) &&
         (pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&in_RDX->d_ptr), pQVar2->transformData == (TransformData *)0x0)) {
        local_358.yp = -NAN;
        local_358.xp = -NAN;
        local_358 = ::operator-(in_stack_fffffffffffffbf8,(QPointF *)in_stack_fffffffffffffbf0);
        if (in_RCX != (QGraphicsItem *)0x0) {
          *(undefined1 *)&in_RCX->_vptr_QGraphicsItem = 1;
        }
        qVar5 = QPointF::x(&local_358);
        qVar6 = QPointF::y(&local_358);
        QTransform::fromTranslate(qVar5,qVar6);
      }
      else {
        memcpy(local_a8,&DAT_00b41ea0,0x50);
        QTransform::QTransform((QTransform *)in_stack_fffffffffffffbf0);
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->(&in_RSI->d_ptr);
        QGraphicsItemPrivate::combineTransformFromParent
                  (in_stack_fffffffffffffc08,
                   (QTransform *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                   (QTransform *)in_stack_fffffffffffffbf8);
        memcpy(local_f8,&DAT_00b41ef0,0x50);
        QTransform::QTransform((QTransform *)in_stack_fffffffffffffbf0);
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->(&in_RDX->d_ptr);
        QGraphicsItemPrivate::combineTransformFromParent
                  (in_stack_fffffffffffffc08,
                   (QTransform *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                   (QTransform *)in_stack_fffffffffffffbf8);
        QTransform::inverted(local_148);
        QTransform::operator*(in_RDI,(QTransform *)local_a8);
      }
    }
    else {
      pQVar4 = commonAncestorItem(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      if (pQVar4 == (QGraphicsItem *)0x0) {
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->(&in_RSI->d_ptr);
        QGraphicsItemPrivate::ensureSceneTransform(in_stack_fffffffffffffbf0);
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->(&in_RDX->d_ptr);
        QGraphicsItemPrivate::ensureSceneTransform(in_stack_fffffffffffffbf0);
        pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&in_RSI->d_ptr);
        pQVar9 = &pQVar2->sceneTransform;
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->(&in_RDX->d_ptr);
        QTransform::inverted(local_198);
        QTransform::operator*(in_RDI,(QTransform *)pQVar9);
      }
      else {
        uVar8 = in_RDX != pQVar4 && in_RSI != pQVar4;
        if (in_RDX != pQVar4 && in_RSI != pQVar4) {
          memcpy(local_1e8,&DAT_00b41f40,0x50);
          itemTransform(in_RDX,in_RCX,(bool *)pQVar7);
          memcpy(&local_238,&DAT_00b41f90,0x50);
          QTransform::QTransform(&local_238,Uninitialized);
          if (in_RCX != (QGraphicsItem *)0x0) {
            *(undefined1 *)&in_RCX->_vptr_QGraphicsItem = 0;
          }
          QTransform::QTransform((QTransform *)in_stack_fffffffffffffbf0);
        }
        else {
          bVar1 = isAncestorOf((QGraphicsItem *)in_stack_fffffffffffffc08,
                               (QGraphicsItem *)CONCAT17(uVar8,in_stack_fffffffffffffc00));
          pQVar7 = in_RDX;
          local_3c8 = in_RSI;
          if (bVar1) {
            pQVar7 = in_RSI;
            local_3c8 = in_RDX;
          }
          pQVar4 = pQVar7;
          viewTransform = local_3c8;
          memcpy(local_328,&DAT_00b41fe0,0x50);
          QTransform::QTransform((QTransform *)pQVar4);
          do {
            QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::data
                      (&local_3c8->d_ptr);
            QGraphicsItemPrivate::combineTransformToParent
                      (in_stack_fffffffffffffc08,
                       (QTransform *)CONCAT17(uVar8,in_stack_fffffffffffffc00),
                       (QTransform *)viewTransform);
            pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->(&local_3c8->d_ptr);
            local_3c8 = pQVar2->parent;
          } while (local_3c8 != (QGraphicsItem *)0x0 && local_3c8 != pQVar7);
          if (bVar1) {
            QTransform::inverted((bool *)in_RDI);
          }
          else {
            if (in_RCX != (QGraphicsItem *)0x0) {
              *(undefined1 *)&in_RCX->_vptr_QGraphicsItem = 1;
            }
            memcpy(in_RDI,local_328,0x50);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QTransform QGraphicsItem::itemTransform(const QGraphicsItem *other, bool *ok) const
{
    // Catch simple cases first.
    if (other == nullptr) {
        qWarning("QGraphicsItem::itemTransform: null pointer passed");
        return QTransform();
    }
    if (other == this) {
        if (ok)
            *ok = true;
        return QTransform();
    }

    QGraphicsItem *parent = d_ptr->parent;
    const QGraphicsItem *otherParent = other->d_ptr->parent;

    // This is other's child
    if (parent == other) {
        if (ok)
            *ok = true;
        QTransform x;
        d_ptr->combineTransformFromParent(&x);
        return x;
    }

    // This is other's parent
    if (otherParent == this) {
        const QPointF &otherPos = other->d_ptr->pos;
        if (other->d_ptr->transformData) {
            QTransform otherToParent;
            other->d_ptr->combineTransformFromParent(&otherToParent);
            return otherToParent.inverted(ok);
        }
        if (ok)
            *ok = true;
        return QTransform::fromTranslate(-otherPos.x(), -otherPos.y());
    }

    // Siblings
    if (parent == otherParent) {
        // COMBINE
        const QPointF &itemPos = d_ptr->pos;
        const QPointF &otherPos = other->d_ptr->pos;
        if (!d_ptr->transformData && !other->d_ptr->transformData) {
            QPointF delta = itemPos - otherPos;
            if (ok)
                *ok = true;
            return QTransform::fromTranslate(delta.x(), delta.y());
        }

        QTransform itemToParent;
        d_ptr->combineTransformFromParent(&itemToParent);
        QTransform otherToParent;
        other->d_ptr->combineTransformFromParent(&otherToParent);
        return itemToParent * otherToParent.inverted(ok);
    }

    // Find the closest common ancestor. If the two items don't share an
    // ancestor, then the only way is to combine their scene transforms.
    const QGraphicsItem *commonAncestor = commonAncestorItem(other);
    if (!commonAncestor) {
        d_ptr->ensureSceneTransform();
        other->d_ptr->ensureSceneTransform();
        return d_ptr->sceneTransform * other->d_ptr->sceneTransform.inverted(ok);
    }

    // If the two items are cousins (in sibling branches), map both to the
    // common ancestor, and combine the two transforms.
    bool cousins = other != commonAncestor && this != commonAncestor;
    if (cousins) {
        bool good = false;
        QTransform thisToScene = itemTransform(commonAncestor, &good);
        QTransform otherToScene(Qt::Uninitialized);
        if (good)
            otherToScene = other->itemTransform(commonAncestor, &good);
        if (!good) {
            if (ok)
                *ok = false;
            return QTransform();
        }
        return thisToScene * otherToScene.inverted(ok);
    }

    // One is an ancestor of the other; walk the chain.
    bool parentOfOther = isAncestorOf(other);
    const QGraphicsItem *child = parentOfOther ? other : this;
    const QGraphicsItem *root = parentOfOther ? this : other;

    QTransform x;
    const QGraphicsItem *p = child;
    do {
        p->d_ptr.data()->combineTransformToParent(&x);
    } while ((p = p->d_ptr->parent) && p != root);
    if (parentOfOther)
        return x.inverted(ok);
    if (ok)
        *ok = true;
    return x;
}